

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Node * CleanNode(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  AttVal **ppAVar3;
  Bool BVar4;
  uint uVar5;
  uint uVar6;
  AttVal *pAVar7;
  Dict *pDVar8;
  tmbstr ptVar9;
  AttVal *pAVar10;
  long lVar11;
  uint i;
  TidyTagId TVar12;
  char *pcVar13;
  AttVal *pAVar14;
  TidyTagId *pTVar15;
  TidyTriState state;
  Node **in_R8;
  Node *pNVar16;
  tmbchar buf [256];
  Node *local_148;
  TidyTriState local_140;
  TidyTriState local_13c;
  tmbchar local_138 [12];
  char acStack_12c [252];
  
  state = *(TidyTriState *)((doc->config).value + 0x58);
  local_13c = *(TidyTriState *)((doc->config).value + 0x5c);
  local_148 = node;
  BVar4 = prvTidynodeIsElement(node);
  pNVar1 = node;
joined_r0x001389ed:
  if (BVar4 != no) {
    if ((pNVar1 == (Node *)0x0) || (pDVar8 = pNVar1->tag, pDVar8 == (Dict *)0x0)) {
LAB_00138a77:
      BVar4 = MergeNestedElements(doc,TidyTag_DIV,state,pNVar1,in_R8);
      if ((BVar4 == no) &&
         (BVar4 = MergeNestedElements(doc,TidyTag_SPAN,local_13c,pNVar1,in_R8), BVar4 == no)) {
        if (pNVar1 != (Node *)0x0) {
          if ((((pNVar1->tag != (Dict *)0x0) && (uVar5 = pNVar1->tag->id - TidyTag_TABLE, uVar5 < 9)
               ) && ((0x125U >> (uVar5 & 0x1f) & 1) != 0)) &&
             (pAVar7 = prvTidyAttrGetById(pNVar1,TidyAttr_BGCOLOR), pAVar7 != (AttVal *)0x0)) {
            prvTidytmbsnprintf(local_138,0x100,"background-color: %s");
            prvTidyRemoveAttribute(doc,pNVar1,pAVar7);
            prvTidyAddStyleProperty(doc,pNVar1,local_138);
          }
          BVar4 = CanApplyBlockStyle(pNVar1);
          if (BVar4 == no) goto LAB_00138cbf;
          if ((pNVar1->tag == (Dict *)0x0) || (pNVar1->tag->id != TidyTag_CAPTION))
          goto LAB_00138c03;
          goto LAB_00138cab;
        }
        BVar4 = prvTidynodeHasCM((Node *)0x0,0xe8);
        if (BVar4 != no) {
LAB_00138c03:
          if (pNVar1->attributes != (AttVal *)0x0) {
            pAVar7 = (AttVal *)0x0;
            pAVar14 = pNVar1->attributes;
            do {
              if ((pAVar14->dict != (Attribute *)0x0) && (pAVar14->dict->id == TidyAttr_ALIGN)) {
                pAVar10 = (AttVal *)&pNVar1->attributes;
                if (pAVar7 != (AttVal *)0x0) {
                  pAVar10 = pAVar7;
                }
                pAVar10->next = pAVar14->next;
                ptVar9 = pAVar14->value;
                if (ptVar9 == (tmbstr)0x0) goto LAB_00138ca0;
                local_140 = state;
                prvTidytmbstrcpy(local_138,"text-align: ");
                lVar11 = 0xc;
                goto LAB_00138c66;
              }
              ppAVar3 = &pAVar14->next;
              pAVar7 = pAVar14;
              pAVar14 = *ppAVar3;
            } while (*ppAVar3 != (AttVal *)0x0);
          }
          goto LAB_00138cab;
        }
        goto LAB_00138cbf;
      }
      goto LAB_00138aa5;
    }
    TVar12 = pDVar8->id;
    if ((TVar12 == TidyTag_DIR) || ((TVar12 == TidyTag_UL || (TVar12 == TidyTag_OL)))) {
      pNVar16 = pNVar1->content;
      if ((pNVar16 == (Node *)0x0) ||
         ((((pNVar16->next != (Node *)0x0 || (pNVar16->tag == (Dict *)0x0)) ||
           (pNVar16->tag->id != TidyTag_LI)) || (pNVar16->implicit == no)))) {
        TVar12 = pDVar8->id;
        goto LAB_00138a2f;
      }
      pDVar8 = prvTidyLookupTagDef(TidyTag_DIV);
      pNVar1->tag = pDVar8;
      (*doc->allocator->vtbl->free)(doc->allocator,pNVar1->element);
      ptVar9 = prvTidytmbstrdup(doc->allocator,"div");
      pNVar1->element = ptVar9;
      pcVar13 = "margin-left: 2em";
      goto LAB_00138ebb;
    }
LAB_00138a2f:
    if (((((TVar12 != TidyTag_UL) && (TVar12 != TidyTag_OL)) ||
         ((pNVar16 = pNVar1->content, pNVar16 == (Node *)0x0 ||
          ((pNVar16->next != (Node *)0x0 || (node = pNVar16->content, node == (Node *)0x0)))))) ||
        (node->tag != pDVar8)) || (node->next != (Node *)0x0)) {
      if (pDVar8->id != TidyTag_CENTER) goto LAB_00138a77;
      RenameElem(doc,pNVar1,TidyTag_DIV);
      pcVar13 = "text-align: center";
LAB_00138a70:
      prvTidyAddStyleProperty(doc,pNVar1,pcVar13);
      goto LAB_00138aa5;
    }
    node->next = pNVar1->next;
    pNVar2 = pNVar1->prev;
    node->parent = pNVar1->parent;
    node->prev = pNVar2;
    prvTidyFixNodeLinks(node);
    pNVar16->content = (Node *)0x0;
    prvTidyFreeNode(doc,pNVar16);
    pNVar1->next = (Node *)0x0;
    pNVar1->content = (Node *)0x0;
    prvTidyFreeNode(doc,pNVar1);
    pNVar1 = node->prev;
    if ((((pNVar1 != (Node *)0x0) && (pNVar1->tag != (Dict *)0x0)) &&
        ((TVar12 = pNVar1->tag->id, TVar12 == TidyTag_UL || (TVar12 == TidyTag_OL)))) &&
       (pNVar16 = pNVar1->last, pNVar16 != (Node *)0x0)) {
      pNVar1->next = node->next;
      prvTidyFixNodeLinks(pNVar1);
      node->parent = pNVar16;
      node->next = (Node *)0x0;
      node->prev = pNVar16->last;
      prvTidyFixNodeLinks(node);
      CleanNode(doc,node);
    }
  }
  return node;
  while (lVar11 = lVar11 + 1, lVar11 != 0x7f) {
LAB_00138c66:
    uVar6 = prvTidyToLower((int)ptVar9[lVar11 + -0xc]);
    local_138[lVar11] = (char)uVar6;
    if ((char)uVar6 == '\0') goto LAB_00138c87;
  }
  lVar11 = 0x7f;
LAB_00138c87:
  local_138[lVar11] = '\0';
  prvTidyAddStyleProperty(doc,pNVar1,local_138);
  state = local_140;
LAB_00138ca0:
  prvTidyFreeAttribute(doc,pAVar14);
LAB_00138cab:
  pNVar16 = pNVar1->content;
  if ((pNVar16 != (Node *)0x0) && (pNVar16->next == (Node *)0x0)) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    pTVar15 = &DAT_0017dc80;
    do {
      if (pNVar16->tag == (Dict *)0x0) {
        if (lVar11 == 4) break;
      }
      else {
        TVar12 = pNVar16->tag->id;
        if (TVar12 == *pTVar15) goto LAB_00138ea4;
        if (lVar11 == 4) goto LAB_00138ed0;
      }
      lVar11 = lVar11 + 1;
      pTVar15 = &DAT_0017dc80 + lVar11 * 6;
      pcVar13 = *(char **)(&UNK_0017dc88 + lVar11 * 0x18);
    } while( true );
  }
LAB_00138cbf:
  BVar4 = CanApplyInlineStyle(pNVar1);
  if (((BVar4 != no) && (pNVar16 = pNVar1->content, pNVar16 != (Node *)0x0)) &&
     (pNVar16->next == (Node *)0x0)) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    pTVar15 = &DAT_0017dc80;
    do {
      if (pNVar16->tag == (Dict *)0x0) {
        if (lVar11 == 4) break;
      }
      else {
        TVar12 = pNVar16->tag->id;
        if (TVar12 == *pTVar15) goto LAB_00138ea4;
        if (lVar11 == 4) goto LAB_00138edb;
      }
      lVar11 = lVar11 + 1;
      pTVar15 = &DAT_0017dc80 + lVar11 * 6;
      pcVar13 = *(char **)(&UNK_0017dc88 + lVar11 * 0x18);
    } while( true );
  }
LAB_00138cdf:
  if (((pNVar1->parent->content != pNVar1) || (pNVar1->next != (Node *)0x0)) ||
     ((BVar4 = CanApplyBlockStyle(pNVar1->parent), BVar4 == no &&
      (BVar4 = CanApplyInlineStyle(pNVar1->parent), BVar4 == no)))) {
    lVar11 = 0;
    pcVar13 = "font-weight: bold";
    do {
      if (((*(int *)((long)&DAT_0017dc90 + lVar11) != 0) && (pNVar1->tag != (Dict *)0x0)) &&
         (pNVar1->tag->id == *(TidyTagId *)((long)&DAT_0017dc80 + lVar11))) {
        RenameElem(doc,pNVar1,TidyTag_SPAN);
        goto LAB_00138a70;
      }
      pcVar13 = *(char **)((long)&PTR_anon_var_dwarf_35330_0017dca0 + lVar11);
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x78);
  }
  if (pNVar1->tag == (Dict *)0x0) {
    return local_148;
  }
  if (pNVar1->tag->id != TidyTag_FONT) {
    return local_148;
  }
  if (*(int *)((doc->config).value + 0x24) == 0) {
    if (((pNVar1->parent->content == pNVar1) && (pNVar1->next == (Node *)0x0)) &&
       (BVar4 = CanApplyBlockStyle(pNVar1->parent), BVar4 != no)) {
      return local_148;
    }
    AddFontStyles(doc,pNVar1,pNVar1->attributes);
    pAVar7 = pNVar1->attributes;
    pAVar14 = (AttVal *)0x0;
    while (pAVar10 = pAVar7, pAVar10 != (AttVal *)0x0) {
      pAVar7 = pAVar10->next;
      if ((pAVar10->dict == (Attribute *)0x0) || (pAVar10->dict->id != TidyAttr_STYLE)) {
        prvTidyFreeAttribute(doc,pAVar10);
      }
      else {
        pAVar10->next = (AttVal *)0x0;
        pAVar14 = pAVar10;
      }
    }
    pNVar1->attributes = pAVar14;
    RenameElem(doc,pNVar1,TidyTag_SPAN);
  }
  else {
    DiscardContainer(doc,pNVar1,&local_148);
  }
LAB_00138aa5:
  pNVar1 = local_148;
  BVar4 = prvTidynodeIsElement(local_148);
  node = local_148;
  goto joined_r0x001389ed;
LAB_00138ed0:
  if (TVar12 == TidyTag_FONT) goto LAB_00138ee4;
  goto LAB_00138cbf;
LAB_00138ea4:
  MergeStyles(doc,pNVar1,pNVar16);
LAB_00138ebb:
  prvTidyAddStyleProperty(doc,pNVar1,pcVar13);
LAB_00138ec0:
  StripOnlyChild(doc,pNVar1);
  goto LAB_00138aa5;
LAB_00138edb:
  if (TVar12 == TidyTag_FONT) {
LAB_00138ee4:
    MergeStyles(doc,pNVar1,pNVar16);
    AddFontStyles(doc,pNVar1,pNVar16->attributes);
    goto LAB_00138ec0;
  }
  goto LAB_00138cdf;
}

Assistant:

Node* CleanNode( TidyDocImpl* doc, Node *node )
{
    Node *next = NULL;
    TidyTriState mergeDivs = cfgAutoBool(doc, TidyMergeDivs);
    TidyTriState mergeSpans = cfgAutoBool(doc, TidyMergeSpans);

    for (next = node; TY_(nodeIsElement)(node); node = next)
    {
        if ( Dir2Div(doc, node, &next) )
            continue;

        /* Special case: true result means
        ** that arg node and its parent no longer exist.
        ** So we must jump back up the CreateStyleProperties()
        ** call stack until we have a valid node reference.
        */
        if ( NestedList(doc, node, &next) )
            return next;

        if ( Center2Div(doc, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_DIV, mergeDivs, node, &next) )
            continue;

        if ( MergeNestedElements(doc, TidyTag_SPAN, mergeSpans, node, &next) )
            continue;

        if ( BlockStyle(doc, node, &next) )
            continue;

        if ( InlineStyle(doc, node, &next) )
            continue;

        if ( InlineElementToCSS(doc, node, &next) )
            continue;

        if ( Font2Span(doc, node, &next) )
            continue;

        break;
    }

    return next;
}